

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::SetBestModel(Model *this)

{
  int iVar1;
  real_t *prVar2;
  ostream *poVar3;
  Logger local_74;
  string local_70;
  string local_50;
  
  if (this->param_best_w_ == (real_t *)0x0) {
    prVar2 = (real_t *)malloc((ulong)this->param_num_w_ << 2);
    this->param_best_w_ = prVar2;
  }
  if (this->param_best_v_ == (real_t *)0x0) {
    iVar1 = std::__cxx11::string::compare((char *)this);
    if (iVar1 != 0) {
      iVar1 = posix_memalign(&this->param_best_v_,0x10,(ulong)this->param_num_v_ << 2);
      if (iVar1 != 0) {
        local_74.severity_ = ERR;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                   ,"");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"SetBestModel","");
        poVar3 = Logger::Start(ERR,&local_50,0x157,&local_70);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"CHECK_EQ failed ",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                   ,0x5f);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x157);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ret",3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"0",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0);
        std::operator<<(poVar3,"\n");
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        Logger::~Logger(&local_74);
        abort();
      }
    }
  }
  if (this->param_best_b_ == (real_t *)0x0) {
    prVar2 = (real_t *)malloc((ulong)this->aux_size_ << 2);
    this->param_best_b_ = prVar2;
  }
  memcpy(this->param_best_w_,this->param_w_,(ulong)this->param_num_w_ << 2);
  memcpy(this->param_best_v_,this->param_v_,(ulong)this->param_num_v_ << 2);
  memcpy(this->param_best_b_,this->param_b_,(ulong)this->aux_size_ << 2);
  return;
}

Assistant:

void Model::SetBestModel() {
  try {
    if (param_best_w_ == nullptr) {
        param_best_w_ = (real_t*)malloc(
        param_num_w_*sizeof(real_t));
    }
    if (param_best_v_ == nullptr &&
        score_func_.compare("linear") != 0) {
  #ifdef _MSC_VER
        param_best_v_ = (decltype(param_best_v_))_aligned_malloc(
        param_num_v_ * sizeof(real_t),
        kAlignByte);
  #else
      int ret = posix_memalign(
                (void**)&param_best_v_,
                kAlignByte,
                param_num_v_ * sizeof(real_t));
      CHECK_EQ(ret, 0);
  #endif
    }
    if (param_best_b_ == nullptr) {
        param_best_b_ = (real_t*)malloc(
         aux_size_ * sizeof(real_t)
        );
    }
  } catch (std::bad_alloc&) {
    LOG(FATAL) << "Cannot allocate enough memory for current  \
                   model parameters. Parameter size: "
               << GetNumParameter();
  }
  // Copy current model parameters
  memcpy(param_best_w_, param_w_, param_num_w_*sizeof(real_t));
  memcpy(param_best_v_, param_v_, param_num_v_*sizeof(real_t));
  memcpy(param_best_b_, param_b_, aux_size_*sizeof(real_t));
}